

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unix.h
# Opt level: O0

timeval llvm::sys::toTimeVal(TimePoint<std::chrono::microseconds> TP)

{
  timeval tVar1;
  rep rVar2;
  int local_54;
  duration<long,std::ratio<1l,1l>> local_50 [8];
  duration<long,_std::ratio<1L,_1000000L>_> local_48;
  duration<long,_std::ratio<1L,_1000000L>_> local_40;
  duration local_38;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  local_30;
  TimePoint<std::chrono::microseconds> TP_local;
  timeval RetVal;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_10;
  
  local_30.__d.__r = TP.__d.__r;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
  ::time_point<std::chrono::duration<long,std::ratio<1l,1000000l>>,void>
            ((time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              *)&local_38,&local_30);
  local_10.__d.__r = (duration)(duration)local_38.__r;
  RetVal.tv_usec =
       (__suseconds_t)
       std::chrono::
       time_point_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                 (&local_10);
  TP_local.__d.__r =
       (duration)std::chrono::_V2::system_clock::to_time_t((time_point *)&RetVal.tv_usec);
  local_48.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                      ::time_since_epoch(&local_30);
  local_54 = 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_50,&local_54);
  local_40.__r = (rep)std::chrono::operator%
                                (&local_48,(duration<long,_std::ratio<1L,_1L>_> *)local_50);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_40);
  tVar1.tv_usec = rVar2;
  tVar1.tv_sec = (__time_t)TP_local.__d.__r;
  return tVar1;
}

Assistant:

inline struct timeval toTimeVal(TimePoint<std::chrono::microseconds> TP) {
  using namespace std::chrono;

  struct timeval RetVal;
  RetVal.tv_sec = toTimeT(TP);
  RetVal.tv_usec = (TP.time_since_epoch() % seconds(1)).count();
  return RetVal;
}